

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpReader.cpp
# Opt level: O3

int __thiscall OpenMD::DumpReader::readStuntDoubles(DumpReader *this,istream *inputStream)

{
  char *__s;
  size_type sVar1;
  size_t sVar2;
  long lVar3;
  long *plVar4;
  int iVar5;
  string line;
  string local_50;
  
  __s = this->buffer;
  std::ios::widen((char)inputStream->_vptr_basic_istream[-3] + (char)inputStream);
  std::istream::getline((char *)inputStream,(long)__s,'\0');
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  sVar2 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,this->buffer + sVar2);
  iVar5 = 0;
  lVar3 = std::__cxx11::string::find((char *)&local_50,0x28a7af,0);
  if (lVar3 == -1) {
    builtin_strncpy(painCave.errMsg + 0x20,"Doubles>\n",10);
    builtin_strncpy(painCave.errMsg + 0x10,": Missing <Stunt",0x10);
    builtin_strncpy(painCave.errMsg,"DumpReader Error",0x10);
    painCave.isFatal = 1;
    simError();
  }
  while( true ) {
    std::ios::widen((char)inputStream->_vptr_basic_istream[-3] + (char)inputStream);
    plVar4 = (long *)std::istream::getline((char *)inputStream,(long)__s,'\0');
    sVar1 = local_50._M_string_length;
    if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) break;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)sVar1,(ulong)__s);
    lVar3 = std::__cxx11::string::find((char *)&local_50,0x28a7e8,0);
    if (lVar3 != -1) break;
    parseDumpLine(this,&local_50);
    iVar5 = iVar5 + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return iVar5;
}

Assistant:

int DumpReader::readStuntDoubles(std::istream& inputStream) {
    inputStream.getline(buffer, bufferSize);
    std::string line(buffer);

    if (line.find("<StuntDoubles>") == std::string::npos) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpReader Error: Missing <StuntDoubles>\n");
      painCave.isFatal = 1;
      simError();
    }

    int nSD = 0;

    while (inputStream.getline(buffer, bufferSize)) {
      line = buffer;

      if (line.find("</StuntDoubles>") != std::string::npos) { break; }

      parseDumpLine(line);
      nSD++;
    }

    return nSD;
  }